

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
Sale::Sale(Sale *this,int id,int quantity,string *date,string *customerName,Medicine *medicine)

{
  Medicine *medicine_local;
  string *customerName_local;
  string *date_local;
  int quantity_local;
  int id_local;
  Sale *this_local;
  
  this->id = id;
  this->quantity = quantity;
  std::__cxx11::string::string((string *)&this->date,(string *)date);
  std::__cxx11::string::string((string *)&this->customerName,(string *)customerName);
  Medicine::Medicine(&this->medicine,medicine);
  return;
}

Assistant:

Sale(int id, int quantity, const string &date, const string &customerName, const Medicine &medicine) : id(id),
                                                                                                           quantity(
                                                                                                                   quantity),
                                                                                                           date(date),
                                                                                                           customerName(
                                                                                                                   customerName),
                                                                                                           medicine(
                                                                                                                   medicine) {}